

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLs_AccessLMemB(void *ida_mem,int which,char *fname,IDAMem *IDA_mem,IDAadjMem *IDAADJ_mem,
                     IDABMem *IDAB_mem,IDALsMemB *idalsB_mem)

{
  long *in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  long *in_R8;
  long *in_R9;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-1,0xa55,in_RDX,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else {
    *in_RCX = in_RDI;
    if (*(int *)(*in_RCX + 0x848) == 0) {
      IDAProcessError((IDAMem)*in_RCX,-0x65,0xa5e,in_RDX,
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                      ,"Illegal attempt to call before calling IDAAdjInit.");
      local_4 = -0x65;
    }
    else {
      *in_R8 = *(long *)(*in_RCX + 0x840);
      if (in_ESI < *(int *)(*in_R8 + 0x38)) {
        *in_R9 = *(long *)(*in_R8 + 0x30);
        while ((*in_R9 != 0 && (in_ESI != *(int *)*in_R9))) {
          *in_R9 = *(long *)(*in_R9 + 0x80);
        }
        if (*(long *)(*in_R9 + 0x48) == 0) {
          IDAProcessError((IDAMem)*in_RCX,-0x66,0xa77,"idaLs_AccessLMemB",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                          ,"Linear solver memory is NULL for the backward integration.");
          local_4 = -0x66;
        }
        else {
          *IDAADJ_mem = *(IDAadjMem *)(*in_R9 + 0x48);
          local_4 = 0;
        }
      }
      else {
        IDAProcessError((IDAMem)*in_RCX,-3,0xa67,in_RDX,
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                        ,"Illegal value for which.");
        local_4 = -3;
      }
    }
  }
  return local_4;
}

Assistant:

int idaLs_AccessLMemB(void* ida_mem, int which, const char* fname,
                      IDAMem* IDA_mem, IDAadjMem* IDAADJ_mem, IDABMem* IDAB_mem,
                      IDALsMemB* idalsB_mem)
{
  /* access IDAMem structure */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  *IDA_mem = (IDAMem)ida_mem;

  /* access IDAadjMem structure */
  if ((*IDA_mem)->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(*IDA_mem, IDALS_NO_ADJ, __LINE__, fname, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  *IDAADJ_mem = (*IDA_mem)->ida_adj_mem;

  /* Check the value of which */
  if (which >= (*IDAADJ_mem)->ia_nbckpbs)
  {
    IDAProcessError(*IDA_mem, IDALS_ILL_INPUT, __LINE__, fname, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to which */
  *IDAB_mem = (*IDAADJ_mem)->IDAB_mem;
  while ((*IDAB_mem) != NULL)
  {
    if (which == (*IDAB_mem)->ida_index) { break; }
    *IDAB_mem = (*IDAB_mem)->ida_next;
  }

  /* access IDALsMemB structure */
  if ((*IDAB_mem)->ida_lmem == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEMB_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEMB_NULL);
    return (IDALS_LMEMB_NULL);
  }
  *idalsB_mem = (IDALsMemB)((*IDAB_mem)->ida_lmem);

  return (IDALS_SUCCESS);
}